

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O3

size_t __thiscall Reducer::reduceDestructively(Reducer *this,int factor_)

{
  size_type *psVar1;
  Module *module;
  size_t sVar2;
  bool bVar3;
  undefined1 local_58 [8];
  ProgramResult result;
  
  this->factor = factor_;
  loadWorking(this);
  this->reduced = 0;
  this->funcsSeen = 0;
  psVar1 = &result.output._M_string_length;
  result.output._M_dataplus._M_p = (pointer)0x0;
  result.output._M_string_length._0_1_ = 0;
  result._0_8_ = psVar1;
  bVar3 = writeAndTestReduction(this,(ProgramResult *)local_58);
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "\n|! WARNING: writing before destructive reduction fails, very unlikely reduction can work\n"
               ,0x5a);
    ProgramResult::dump((ProgramResult *)local_58,(ostream *)&std::cerr);
    result.time._7_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,(char *)((long)&result.time + 7),1);
  }
  module = (this->
           super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
           ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
           super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.currModule;
  wasm::Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doWalkModule
            (&(this->
              super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
              ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
              super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,module);
  visitModule(this,module);
  (this->
  super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>).
  super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
  super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.currModule = (Module *)0x0;
  sVar2 = this->reduced;
  if ((size_type *)result._0_8_ != psVar1) {
    operator_delete((void *)result._0_8_,
                    CONCAT71(result.output._M_string_length._1_7_,
                             (undefined1)result.output._M_string_length) + 1);
  }
  return sVar2;
}

Assistant:

size_t reduceDestructively(int factor_) {
    factor = factor_;
    // prepare
    loadWorking();
    reduced = 0;
    funcsSeen = 0;
    // Before we do any changes, it should be valid to write out the module:
    // size should be as expected, and output should be as expected.
    ProgramResult result;
    if (!writeAndTestReduction(result)) {
      std::cerr << "\n|! WARNING: writing before destructive reduction fails, "
                   "very unlikely reduction can work\n"
                << result << '\n';
    }
    // destroy!
    walkModule(getModule());
    return reduced;
  }